

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putil.cpp
# Opt level: O2

void u_versionToString_63(uint8_t *versionArray,char *versionString)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  ushort uVar4;
  ulong uVar5;
  
  if (versionString != (char *)0x0) {
    if (versionArray != (uint8_t *)0x0) {
      uVar4 = 4;
      do {
        uVar3 = uVar4;
        if (uVar3 == 0) break;
        uVar4 = uVar3 - 1;
      } while (versionArray[(ulong)uVar3 - 1] == '\0');
      uVar4 = 2;
      if (2 < uVar3) {
        uVar4 = uVar3;
      }
      bVar2 = *versionArray;
      if (99 < bVar2) {
        bVar1 = bVar2 / 100;
        bVar2 = bVar2 % 100;
        *versionString = bVar1 | 0x30;
        versionString = versionString + 1;
      }
      if (9 < bVar2) {
        bVar1 = bVar2 / 10;
        bVar2 = bVar2 % 10;
        *versionString = bVar1 | 0x30;
        versionString = (char *)((byte *)versionString + 1);
      }
      *versionString = bVar2 | 0x30;
      for (uVar5 = 1; uVar5 < uVar4; uVar5 = uVar5 + 1) {
        ((byte *)versionString)[1] = 0x2e;
        bVar2 = versionArray[uVar5];
        if (bVar2 < 100) {
          versionString = (char *)((byte *)versionString + 2);
        }
        else {
          bVar1 = bVar2 / 100;
          bVar2 = bVar2 % 100;
          ((byte *)versionString)[2] = bVar1 | 0x30;
          versionString = (char *)((byte *)versionString + 3);
        }
        if (9 < bVar2) {
          bVar1 = bVar2 / 10;
          bVar2 = bVar2 % 10;
          *versionString = bVar1 | 0x30;
          versionString = (char *)((byte *)versionString + 1);
        }
        *versionString = bVar2 | 0x30;
      }
      versionString = (char *)((byte *)versionString + 1);
    }
    *versionString = 0;
  }
  return;
}

Assistant:

U_CAPI void U_EXPORT2
u_versionToString(const UVersionInfo versionArray, char *versionString) {
    uint16_t count, part;
    uint8_t field;

    if(versionString==NULL) {
        return;
    }

    if(versionArray==NULL) {
        versionString[0]=0;
        return;
    }

    /* count how many fields need to be written */
    for(count=4; count>0 && versionArray[count-1]==0; --count) {
    }

    if(count <= 1) {
        count = 2;
    }

    /* write the first part */
    /* write the decimal field value */
    field=versionArray[0];
    if(field>=100) {
        *versionString++=(char)('0'+field/100);
        field%=100;
    }
    if(field>=10) {
        *versionString++=(char)('0'+field/10);
        field%=10;
    }
    *versionString++=(char)('0'+field);

    /* write the following parts */
    for(part=1; part<count; ++part) {
        /* write a dot first */
        *versionString++=U_VERSION_DELIMITER;

        /* write the decimal field value */
        field=versionArray[part];
        if(field>=100) {
            *versionString++=(char)('0'+field/100);
            field%=100;
        }
        if(field>=10) {
            *versionString++=(char)('0'+field/10);
            field%=10;
        }
        *versionString++=(char)('0'+field);
    }

    /* NUL-terminate */
    *versionString=0;
}